

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

void __thiscall capnp::DynamicStruct::Reader::verifySetInUnion(Reader *this,Field field)

{
  DebugExpression<bool> _kjCondition;
  Fault f;
  ArrayPtr<const_char> local_98;
  ArrayPtr<const_char> local_88;
  Reader local_78;
  Reader local_48;
  
  _kjCondition.value = isSetInUnion(this,field);
  if (_kjCondition.value) {
    return;
  }
  local_78._reader.dataSize = field.proto._reader.dataSize;
  local_78._reader.pointerCount = field.proto._reader.pointerCount;
  local_78._reader._38_2_ = field.proto._reader._38_2_;
  local_78._reader.nestingLimit = field.proto._reader.nestingLimit;
  local_78._reader._44_4_ = field.proto._reader._44_4_;
  local_78._reader.data = field.proto._reader.data;
  local_78._reader.pointers = field.proto._reader.pointers;
  local_78._reader.segment = field.proto._reader.segment;
  local_78._reader.capTable = field.proto._reader.capTable;
  local_88 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName(&local_78);
  Schema::getProto(&local_48,(Schema *)this);
  local_98 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_48);
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[66],capnp::Text::Reader,capnp::Text::Reader>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
             ,0x8f,FAILED,"isSetInUnion(field)",
             "_kjCondition,\"Tried to get() a union member which is not currently initialized.\", field.getProto().getName(), schema.getProto().getDisplayName()"
             ,&_kjCondition,
             (char (*) [66])"Tried to get() a union member which is not currently initialized.",
             (Reader *)&local_88,(Reader *)&local_98);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void DynamicStruct::Reader::verifySetInUnion(StructSchema::Field field) const {
  KJ_REQUIRE(isSetInUnion(field),
      "Tried to get() a union member which is not currently initialized.",
      field.getProto().getName(), schema.getProto().getDisplayName());
}